

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O2

void cJSON_Minify(char *json)

{
  byte bVar1;
  byte *pbVar2;
  ulong uVar3;
  char *into;
  byte *pbVar4;
  
  pbVar4 = (byte *)json;
  if (json == (char *)0x0) {
    return;
  }
LAB_00107fd1:
  do {
    bVar1 = *pbVar4;
    uVar3 = (ulong)bVar1;
    if (0x2f < uVar3) goto LAB_00108046;
    if ((0x100002600U >> (uVar3 & 0x3f) & 1) == 0) break;
LAB_00107fe0:
    pbVar4 = pbVar4 + 1;
  } while( true );
  if (uVar3 == 0x22) {
LAB_00108014:
    *json = 0x22;
    pbVar4 = pbVar4 + 2;
    pbVar2 = (byte *)json;
    do {
      json = (char *)(pbVar2 + 1);
      if (pbVar4[-1] == 0) {
        pbVar4 = pbVar4 + -1;
        goto LAB_00107fd1;
      }
      *json = pbVar4[-1];
      if (pbVar4[-1] == 0x5c) {
        if (*pbVar4 == 0x22) goto LAB_00108041;
      }
      else if (pbVar4[-1] == 0x22) {
        *json = 0x22;
        json = (char *)(pbVar2 + 2);
        goto LAB_00107fd1;
      }
      pbVar4 = pbVar4 + 1;
      pbVar2 = (byte *)json;
    } while( true );
  }
  if (uVar3 == 0x2f) {
    if (pbVar4[1] == 0x2a) {
      pbVar4 = pbVar4 + 2;
      do {
        if (*pbVar4 == 0x2a) {
          if (pbVar4[1] == 0x2f) {
            pbVar4 = pbVar4 + 2;
            goto LAB_00107fd1;
          }
        }
        else if (*pbVar4 == 0) goto LAB_00107fd1;
        pbVar4 = pbVar4 + 1;
      } while( true );
    }
    if (pbVar4[1] == 0x2f) {
      for (pbVar4 = pbVar4 + 2; *pbVar4 != 0; pbVar4 = pbVar4 + 1) {
        if (*pbVar4 == 10) goto LAB_00107fe0;
      }
    }
  }
  else {
LAB_00108046:
    if (bVar1 == 0) {
      *json = 0;
      return;
    }
    *json = bVar1;
    json = (char *)((byte *)json + 1);
    pbVar4 = pbVar4 + 1;
  }
  goto LAB_00107fd1;
LAB_00108041:
  json = (char *)(pbVar2 + 2);
  goto LAB_00108014;
}

Assistant:

CJSON_PUBLIC(void) cJSON_Minify(char *json)
{
    char *into = json;

    if (json == NULL)
    {
        return;
    }

    while (json[0] != '\0')
    {
        switch (json[0])
        {
            case ' ':
            case '\t':
            case '\r':
            case '\n':
                json++;
                break;

            case '/':
                if (json[1] == '/')
                {
                    skip_oneline_comment(&json);
                }
                else if (json[1] == '*')
                {
                    skip_multiline_comment(&json);
                }
                break;

            case '\"':
                minify_string(&json, (char**)&into);
                break;

            default:
                into[0] = json[0];
                json++;
                into++;
        }
    }

    /* and null-terminate. */
    *into = '\0';
}